

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

double __thiscall asl::Date::localOffset(Date *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  double dVar7;
  int local_60;
  int o;
  int yU;
  int dU;
  int hU;
  tm *tmU;
  int yL;
  int dL;
  int hL;
  tm *tmL;
  time_t tm;
  double y;
  double t;
  Date *this_local;
  
  dVar1 = this->_t;
  y = dVar1;
  t = (double)this;
  if ((dVar1 < 0.0) || (2145916800.0 < dVar1)) {
    tm = 0x417e185580000000;
    dVar7 = floor(dVar1 / 31556952.0 - 2.0);
    y = -dVar7 * 31556952.0 + dVar1;
  }
  tmL = (tm *)(long)y;
  ptVar6 = localtime((time_t *)&tmL);
  if (ptVar6 == (tm *)0x0) {
    this_local = (Date *)0x0;
  }
  else {
    local_60 = ptVar6->tm_hour;
    iVar2 = ptVar6->tm_yday;
    iVar3 = ptVar6->tm_year;
    ptVar6 = gmtime((time_t *)&tmL);
    iVar4 = ptVar6->tm_yday;
    iVar5 = ptVar6->tm_year;
    local_60 = local_60 - ptVar6->tm_hour;
    if (((iVar5 < iVar3) && (iVar2 < iVar4)) || ((iVar3 == iVar5 && (iVar4 < iVar2)))) {
      local_60 = local_60 + 0x18;
    }
    else if (((iVar3 < iVar5) && (iVar4 < iVar2)) || ((iVar3 == iVar5 && (iVar2 < iVar4)))) {
      local_60 = local_60 + -0x18;
    }
    this_local = (Date *)(double)(local_60 * 0xe10);
  }
  return (double)this_local;
}

Assistant:

double Date::localOffset() const
{
	double t = _t;
	if (t < 0 || t > 2145916800.0) // approximate offset out of epoch
	{
		const double y = 86400 * daysInYearAve;
		t = t - floor(t / y - 2) * y;
	}
	time_t     tm = (time_t)t;
	struct tm* tmL = localtime(&tm);
	if (!tmL)
		return 0;
	int        hL = tmL->tm_hour;
	int        dL = tmL->tm_yday;
	int        yL = tmL->tm_year;
	struct tm* tmU = gmtime(&tm);
	int        hU = tmU->tm_hour;
	int        dU = tmU->tm_yday;
	int        yU = tmU->tm_year;
	int        o = hL - hU;
	if ((yL > yU && dL < dU) || (yL == yU && dL > dU))
		o += 24;
	else if ((yL < yU && dL > dU) || (yL == yU && dL < dU))
		o -= 24;
	return o * 3600;
}